

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniOutputSubcom_Test::~TApp_IniOutputSubcom_Test(TApp_IniOutputSubcom_Test *this)

{
  TApp_IniOutputSubcom_Test *this_local;
  
  ~TApp_IniOutputSubcom_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniOutputSubcom) {

    app.add_flag("--simple");
    auto subcom = app.add_subcommand("other");
    subcom->add_flag("--newer");

    args = {"--simple", "other", "--newer"};
    run();

    std::string str = app.config_to_str();
    EXPECT_THAT(str, HasSubstr("simple=true"));
    EXPECT_THAT(str, HasSubstr("other.newer=true"));
}